

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void shot_around_ship(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
                      *battle_field,string *coordinates)

{
  bool bVar1;
  char *pcVar2;
  string local_228 [32];
  string local_208 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  local_1e8;
  string local_1b8 [32];
  string local_198 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  local_178;
  string local_148 [32];
  string local_128 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  local_108;
  string local_d8 [32];
  string local_b8 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  local_98;
  string local_58 [32];
  string local_38 [8];
  string sub_coordinates;
  string *coordinates_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
  *battle_field_local;
  
  std::__cxx11::string::string(local_38,(string *)coordinates);
  std::__cxx11::string::string(local_58,(string *)coordinates);
  shot_around_cell(battle_field,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  while( true ) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::map(&local_98,battle_field);
    std::__cxx11::string::string(local_b8,(string *)coordinates);
    bVar1 = check_left_ship(&local_98,(string *)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::~map(&local_98);
    if (!bVar1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
    *pcVar2 = *pcVar2 + -1;
    std::__cxx11::string::string(local_d8,(string *)coordinates);
    shot_around_cell(battle_field,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
  }
  std::__cxx11::string::operator=((string *)coordinates,local_38);
  while( true ) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::map(&local_108,battle_field);
    std::__cxx11::string::string(local_128,(string *)coordinates);
    bVar1 = check_right_ship(&local_108,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::~map(&local_108);
    if (!bVar1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
    *pcVar2 = *pcVar2 + '\x01';
    std::__cxx11::string::string(local_148,(string *)coordinates);
    shot_around_cell(battle_field,(string *)local_148);
    std::__cxx11::string::~string(local_148);
  }
  std::__cxx11::string::operator=((string *)coordinates,local_38);
  while( true ) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::map(&local_178,battle_field);
    std::__cxx11::string::string(local_198,(string *)coordinates);
    bVar1 = check_up_ship(&local_178,(string *)local_198);
    std::__cxx11::string::~string(local_198);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::~map(&local_178);
    if (!bVar1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
    *pcVar2 = *pcVar2 + -1;
    std::__cxx11::string::string(local_1b8,(string *)coordinates);
    shot_around_cell(battle_field,(string *)local_1b8);
    std::__cxx11::string::~string(local_1b8);
  }
  std::__cxx11::string::operator=((string *)coordinates,local_38);
  while( true ) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::map(&local_1e8,battle_field);
    std::__cxx11::string::string(local_208,(string *)coordinates);
    bVar1 = check_down_ship(&local_1e8,(string *)local_208);
    std::__cxx11::string::~string(local_208);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
    ::~map(&local_1e8);
    if (!bVar1) break;
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)coordinates);
    *pcVar2 = *pcVar2 + '\x01';
    std::__cxx11::string::string(local_228,(string *)coordinates);
    shot_around_cell(battle_field,(string *)local_228);
    std::__cxx11::string::~string(local_228);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void shot_around_ship (map <string, unsigned short> &battle_field, string coordinates){
    string sub_coordinates=coordinates;
    shot_around_cell (battle_field, coordinates);
    while(check_left_ship(battle_field, coordinates)){
        --coordinates[0];
        shot_around_cell (battle_field, coordinates);
    }
    coordinates=sub_coordinates;
    while(check_right_ship(battle_field, coordinates)){
        ++coordinates[0];
        shot_around_cell (battle_field, coordinates);
    }
    coordinates=sub_coordinates;
    while(check_up_ship(battle_field, coordinates)){
        --coordinates[1];
        shot_around_cell (battle_field, coordinates);
    }
    coordinates=sub_coordinates;
    while(check_down_ship(battle_field, coordinates)){
        ++coordinates[1];
        shot_around_cell (battle_field, coordinates);
    }
}